

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBitDxEa<(moira::Instr)34,(moira::Mode)4,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  char *pcVar5;
  
  pcVar5 = "btst";
  if (str->upper != false) {
    pcVar5 = "BTST";
  }
  cVar1 = *pcVar5;
  while (cVar1 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar1;
    cVar1 = *pcVar5;
  }
  iVar2 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar2) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  str->ptr = pcVar5 + 1;
  *pcVar5 = 'D';
  pbVar4 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar4 + 1);
  *pbVar4 = (byte)(op >> 9) & 7 | 0x30;
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ' ';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '-';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '(';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = 'A';
  pbVar4 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar4 + 1);
  *pbVar4 = (byte)op & 7 | 0x30;
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ')';
  return;
}

Assistant:

void
Moira::dasmBitDxEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src << ", " << dst;
}